

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.c
# Opt level: O0

cf_int32_t cf_datetime_day_of_year(cf_datetime_t *dt)

{
  uint local_18;
  cf_bool_t leap_year;
  cf_uint32_t i;
  cf_int32_t d;
  cf_datetime_t *dt_local;
  
  leap_year = 0;
  for (local_18 = 0; local_18 < ((uint)(*(ulong *)dt >> 0xc) & 0xf); local_18 = local_18 + 1) {
    leap_year = g_mondays[local_18] + leap_year;
  }
  return ((uint)((ulong)*(undefined8 *)dt >> 0x10) & 0x1f) + leap_year;
}

Assistant:

cf_int32_t cf_datetime_day_of_year(const cf_datetime_t* dt) {
    cf_int32_t d = 0;
    cf_uint32_t i;
    cf_bool_t leap_year = CF_FALSE;
    leap_year = CF_IS_LEAP_YEAR(dt->year);
    for (i = 0; i < dt->month; i++) {
        d += g_mondays[i];
    }
    if (dt->month > 2 && leap_year) d++;
    d += dt->day;
    return d;
}